

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

void xmlXPathDivValues(xmlXPathParserContextPtr ctxt)

{
  xmlXPathObjectPtr val_00;
  double dVar1;
  double val;
  xmlXPathObjectPtr arg;
  xmlXPathParserContextPtr ctxt_local;
  
  val_00 = valuePop(ctxt);
  if (val_00 == (xmlXPathObjectPtr)0x0) {
    xmlXPathErr(ctxt,10);
  }
  else {
    dVar1 = xmlXPathCastToNumber(val_00);
    xmlXPathReleaseObject(ctxt->context,val_00);
    if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_NUMBER)) {
      xmlXPathNumberFunction(ctxt,1);
    }
    if ((ctxt->value == (xmlXPathObjectPtr)0x0) || (ctxt->value->type != XPATH_NUMBER)) {
      xmlXPathErr(ctxt,0xb);
    }
    else {
      ctxt->value->floatval = ctxt->value->floatval / dVar1;
    }
  }
  return;
}

Assistant:

void
xmlXPathDivValues(xmlXPathParserContextPtr ctxt) {
    xmlXPathObjectPtr arg;
    double val;

    arg = valuePop(ctxt);
    if (arg == NULL)
	XP_ERROR(XPATH_INVALID_OPERAND);
    val = xmlXPathCastToNumber(arg);
    xmlXPathReleaseObject(ctxt->context, arg);
    CAST_TO_NUMBER;
    CHECK_TYPE(XPATH_NUMBER);
    ctxt->value->floatval /= val;
}